

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ParseSetColset(Fts5Parse *pParse,Fts5ExprNode *pNode,Fts5Colset *pColset,
                       Fts5Colset **ppFree)

{
  Fts5ExprNearset *pFVar1;
  Fts5Colset *pFVar2;
  int local_34;
  int i;
  Fts5ExprNearset *pNear;
  Fts5Colset **ppFree_local;
  Fts5Colset *pColset_local;
  Fts5ExprNode *pNode_local;
  Fts5Parse *pParse_local;
  
  if (pParse->rc == 0) {
    if ((pNode->eType == 9) || (pNode->eType == 4)) {
      pFVar1 = pNode->pNear;
      if (pFVar1->pColset == (Fts5Colset *)0x0) {
        if (*ppFree == (Fts5Colset *)0x0) {
          pFVar2 = fts5CloneColset(&pParse->rc,pColset);
          pFVar1->pColset = pFVar2;
        }
        else {
          pFVar1->pColset = pColset;
          *ppFree = (Fts5Colset *)0x0;
        }
      }
      else {
        fts5MergeColset(pFVar1->pColset,pColset);
        if (pFVar1->pColset->nCol == 0) {
          pNode->eType = 0;
          pNode->xNext = (_func_int_Fts5Expr_ptr_Fts5ExprNode_ptr_int_i64 *)0x0;
        }
      }
    }
    else {
      for (local_34 = 0; local_34 < pNode->nChild; local_34 = local_34 + 1) {
        fts5ParseSetColset(pParse,pNode->apChild[local_34],pColset,ppFree);
      }
    }
  }
  return;
}

Assistant:

static void fts5ParseSetColset(
  Fts5Parse *pParse, 
  Fts5ExprNode *pNode, 
  Fts5Colset *pColset,
  Fts5Colset **ppFree
){
  if( pParse->rc==SQLITE_OK ){
    assert( pNode->eType==FTS5_TERM || pNode->eType==FTS5_STRING 
         || pNode->eType==FTS5_AND  || pNode->eType==FTS5_OR
         || pNode->eType==FTS5_NOT  || pNode->eType==FTS5_EOF
    );
    if( pNode->eType==FTS5_STRING || pNode->eType==FTS5_TERM ){
      Fts5ExprNearset *pNear = pNode->pNear;
      if( pNear->pColset ){
        fts5MergeColset(pNear->pColset, pColset);
        if( pNear->pColset->nCol==0 ){
          pNode->eType = FTS5_EOF;
          pNode->xNext = 0;
        }
      }else if( *ppFree ){
        pNear->pColset = pColset;
        *ppFree = 0;
      }else{
        pNear->pColset = fts5CloneColset(&pParse->rc, pColset);
      }
    }else{
      int i;
      assert( pNode->eType!=FTS5_EOF || pNode->nChild==0 );
      for(i=0; i<pNode->nChild; i++){
        fts5ParseSetColset(pParse, pNode->apChild[i], pColset, ppFree);
      }
    }
  }
}